

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_ArcClose2D(X3DImporter *this)

{
  FIReader *pFVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  CX3DImporter_NodeElement_Geometry2D *this_00;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *this_01;
  uint pAttrIdx;
  string *psVar5;
  CX3DImporter_NodeElement *pCVar6;
  allocator local_c9;
  CX3DImporter_NodeElement *ne;
  float local_c0;
  float local_bc;
  undefined4 local_b8;
  float local_b4;
  string an;
  string closureType;
  string use;
  string def;
  
  def._M_dataplus._M_p = (pointer)&def.field_2;
  def._M_string_length = 0;
  def.field_2._M_local_buf[0] = '\0';
  use._M_dataplus._M_p = (pointer)&use.field_2;
  use._M_string_length = 0;
  use.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&closureType,"PIE",(allocator *)&an);
  ne = (CX3DImporter_NodeElement *)0x0;
  uVar3 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  local_b8 = 0;
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  local_c0 = 0.0;
  local_b4 = 1.0;
  local_bc = 1.5707964;
  for (pAttrIdx = 0; uVar3 != pAttrIdx; pAttrIdx = pAttrIdx + 1) {
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar4 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar1,(ulong)pAttrIdx);
    std::__cxx11::string::string((string *)&an,(char *)CONCAT44(extraout_var_00,iVar4),&local_c9);
    bVar2 = std::operator==(&an,"DEF");
    if (bVar2) {
      pFVar1 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                (pFVar1,(ulong)pAttrIdx);
      psVar5 = &def;
LAB_005b1f79:
      std::__cxx11::string::assign((char *)psVar5);
    }
    else {
      bVar2 = std::operator==(&an,"USE");
      if (bVar2) {
        pFVar1 = (this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
        (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                  (pFVar1,(ulong)pAttrIdx);
        psVar5 = &use;
        goto LAB_005b1f79;
      }
      bVar2 = std::operator==(&an,"bboxCenter");
      if (!bVar2) {
        bVar2 = std::operator==(&an,"bboxSize");
        if (!bVar2) {
          bVar2 = std::operator==(&an,"containerField");
          if (!bVar2) {
            bVar2 = std::operator==(&an,"closureType");
            if (bVar2) {
              pFVar1 = (this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
              (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar1,(ulong)pAttrIdx);
              psVar5 = &closureType;
              goto LAB_005b1f79;
            }
            bVar2 = std::operator==(&an,"endAngle");
            if (bVar2) {
              local_bc = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
            }
            else {
              bVar2 = std::operator==(&an,"radius");
              if (bVar2) {
                local_b4 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
              }
              else {
                bVar2 = std::operator==(&an,"solid");
                if (bVar2) {
                  bVar2 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                  local_b8 = (undefined4)CONCAT71(extraout_var,bVar2);
                }
                else {
                  bVar2 = std::operator==(&an,"startAngle");
                  if (bVar2) {
                    local_c0 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                  }
                  else {
                    Throw_IncorrectAttr(this,&an);
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&an);
  }
  if (use._M_string_length != 0) {
    XML_CheckNode_MustBeEmpty(this);
    if (def._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar2 = FindNodeElement(this,&use,ENET_ArcClose2D,&ne);
    if (!bVar2) {
      Throw_USE_NotFound(this,&use);
    }
    this_01 = &this->NodeElement_Cur->Child;
    goto LAB_005b2260;
  }
  this_00 = (CX3DImporter_NodeElement_Geometry2D *)operator_new(0x78);
  CX3DImporter_NodeElement_Geometry2D::CX3DImporter_NodeElement_Geometry2D
            (this_00,ENET_ArcClose2D,this->NodeElement_Cur);
  ne = (CX3DImporter_NodeElement *)this_00;
  if (def._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&(this_00->super_CX3DImporter_NodeElement).ID);
  }
  ne[1].ID.field_2._M_local_buf[0] = (byte)local_b8 & 1;
  GeometryHelper_Make_Arc2D
            (this,local_c0,local_bc,local_b4,10,
             (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(ne + 1));
  if (ABS(local_bc - local_c0) < 6.2831855) {
    if ((local_bc != local_c0) || (NAN(local_bc) || NAN(local_c0))) {
      pCVar6 = ne + 1;
      bVar2 = std::operator==(&closureType,"PIE");
      if (bVar2) {
LAB_005b21ce:
        an._M_dataplus._M_p = (pointer)0x0;
        an._M_string_length._0_4_ = 0;
        std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar6,
                   (value_type *)&an);
      }
      else {
        bVar2 = std::operator==(&closureType,"\"PIE\"");
        if (bVar2) goto LAB_005b21ce;
        bVar2 = std::operator!=(&closureType,"CHORD");
        if (bVar2) {
          bVar2 = std::operator!=(&closureType,"\"CHORD\"");
          if (bVar2) {
            std::__cxx11::string::string((string *)&an,"closureType",&local_c9);
            Throw_IncorrectAttrValue(this,&an);
            std::__cxx11::string::~string((string *)&an);
          }
        }
      }
      std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar6,
                 (value_type *)
                 ((((_List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   &pCVar6->_vptr_CX3DImporter_NodeElement)->_M_impl)._M_node.super__List_node_base.
                  _M_next + 1));
    }
  }
  ne[1].ID._M_string_length = (size_type)ne[1].ID._M_dataplus._M_p;
  iVar4 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
  pCVar6 = ne;
  if ((char)iVar4 == '\0') {
    std::__cxx11::string::string((string *)&an,"ArcClose2D",&local_c9);
    ParseNode_Metadata(this,pCVar6,&an);
    std::__cxx11::string::~string((string *)&an);
  }
  else {
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,&ne);
  }
  this_01 = &this->NodeElement_List;
LAB_005b2260:
  std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
  push_back(this_01,&ne);
  std::__cxx11::string::~string((string *)&closureType);
  std::__cxx11::string::~string((string *)&use);
  std::__cxx11::string::~string((string *)&def);
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_ArcClose2D()
{
    std::string def, use;
    std::string closureType("PIE");
    float endAngle = AI_MATH_HALF_PI_F;
    float radius = 1;
    bool solid = false;
    float startAngle = 0;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("closureType", closureType, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("endAngle", endAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("radius", radius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("startAngle", startAngle, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_ArcClose2D, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_ArcClose2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_Geometry2D*)ne)->Solid = solid;
		// create point list of geometry object.
		GeometryHelper_Make_Arc2D(startAngle, endAngle, radius, 10, ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices);///TODO: IME - AI_CONFIG for NumSeg
		// add chord or two radiuses only if not a circle was defined
		if(!((std::fabs(endAngle - startAngle) >= AI_MATH_TWO_PI_F) || (endAngle == startAngle)))
		{
			std::list<aiVector3D>& vlist = ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices;// just short alias.

			if((closureType == "PIE") || (closureType == "\"PIE\""))
				vlist.push_back(aiVector3D(0, 0, 0));// center point - first radial line
			else if((closureType != "CHORD") && (closureType != "\"CHORD\""))
				Throw_IncorrectAttrValue("closureType");

			vlist.push_back(*vlist.begin());// arc first point - chord from first to last point of arc(if CHORD) or second radial line(if PIE).
		}

		((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices.size();
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "ArcClose2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}